

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_optLdm_processMatchCandidate
               (ZSTD_optLdm_t *optLdm,ZSTD_match_t *matches,U32 *nbMatches,U32 currPosInBlock,
               U32 remainingBytes)

{
  U32 UVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (optLdm->seqStore).size;
  if ((uVar2 != 0) && ((optLdm->seqStore).pos < uVar2)) {
    uVar3 = optLdm->endPosInBlock;
    if (uVar3 <= currPosInBlock) {
      if (uVar3 <= currPosInBlock && currPosInBlock - uVar3 != 0) {
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore,(ulong)(currPosInBlock - uVar3));
      }
      ZSTD_opt_getNextMatchAndUpdateSeqStore(optLdm,currPosInBlock,remainingBytes);
      uVar3 = optLdm->endPosInBlock;
    }
    if ((optLdm->startPosInBlock <= currPosInBlock) &&
       (uVar4 = uVar3 - currPosInBlock, 2 < uVar4 && (currPosInBlock <= uVar3 && uVar4 != 0))) {
      uVar3 = *nbMatches;
      if (((ulong)uVar3 == 0) || ((uVar3 < 0x1000 && (matches[uVar3 - 1].len < uVar4)))) {
        UVar1 = optLdm->offset;
        matches[uVar3].len = uVar4;
        matches[*nbMatches].off = UVar1 + 3;
        *nbMatches = *nbMatches + 1;
      }
    }
  }
  return;
}

Assistant:

static void
ZSTD_optLdm_processMatchCandidate(ZSTD_optLdm_t* optLdm,
                                  ZSTD_match_t* matches, U32* nbMatches,
                                  U32 currPosInBlock, U32 remainingBytes)
{
    if (optLdm->seqStore.size == 0 || optLdm->seqStore.pos >= optLdm->seqStore.size) {
        return;
    }

    if (currPosInBlock >= optLdm->endPosInBlock) {
        if (currPosInBlock > optLdm->endPosInBlock) {
            /* The position at which ZSTD_optLdm_processMatchCandidate() is called is not necessarily
             * at the end of a match from the ldm seq store, and will often be some bytes
             * over beyond matchEndPosInBlock. As such, we need to correct for these "overshoots"
             */
            U32 const posOvershoot = currPosInBlock - optLdm->endPosInBlock;
            ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, posOvershoot);
        }
        ZSTD_opt_getNextMatchAndUpdateSeqStore(optLdm, currPosInBlock, remainingBytes);
    }
    ZSTD_optLdm_maybeAddMatch(matches, nbMatches, optLdm, currPosInBlock);
}